

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

CopyConst<const_char,_ElementType<2UL>_> * __thiscall
phmap::priv::internal_layout::
LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>*,unsigned_char,int,phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
::Pointer<2ul,char_const>
          (LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>*,unsigned_char,int,phmap::priv::btree_node<phmap::priv::set_params<int,phmap::Less<int>,std::allocator<int>,256,false>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
           *this,char *p)

{
  size_t sVar1;
  size_t alignment;
  char *p_local;
  LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_unsigned_char,_int,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  *this_local;
  
  if (((ulong)p & 7) == 0) {
    sVar1 = LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_unsigned_char,_int,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
            ::Offset<2UL,_0>((LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*,_unsigned_char,_int,_phmap::priv::btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_false>_>_*>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                              *)this);
    return (CopyConst<const_char,_ElementType<2UL>_> *)(p + sVar1);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *, unsigned char, int, phmap::priv::btree_node<phmap::priv::set_params<int, phmap::Less<int>, std::allocator<int>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = const char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }